

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddCustomCommandCommand.cxx
# Opt level: O2

bool __thiscall
cmAddCustomCommandCommand::CheckOutputs
          (cmAddCustomCommandCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs)

{
  string *psVar1;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  string *fileName;
  string e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0 [11];
  
  fileName = (outputs->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (outputs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (fileName == psVar1) {
LAB_001e7de7:
      return fileName == psVar1;
    }
    bVar2 = cmMakefile::CanIWriteThisFile((this->super_cmCommand).Makefile,fileName);
    if (!bVar2) {
      std::operator+(&local_1c0,"attempted to have a file \"",fileName);
      std::operator+(local_1a0,&local_1c0,"\" in a source directory as an output of custom command."
                    );
      std::__cxx11::string::~string((string *)&local_1c0);
      cmCommand::SetError(&this->super_cmCommand,local_1a0);
      cmSystemTools::s_FatalErrorOccured = true;
      std::__cxx11::string::~string((string *)local_1a0);
      goto LAB_001e7de7;
    }
    lVar3 = std::__cxx11::string::find_first_of((char *)fileName,0x41debd);
    if (lVar3 != -1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
      poVar4 = std::operator<<((ostream *)local_1a0,"called with OUTPUT containing a \"");
      poVar4 = std::operator<<(poVar4,(fileName->_M_dataplus)._M_p[lVar3]);
      std::operator<<(poVar4,"\".  This character is not allowed.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
      goto LAB_001e7de7;
    }
    fileName = fileName + 1;
  } while( true );
}

Assistant:

bool cmAddCustomCommandCommand::CheckOutputs(
  const std::vector<std::string>& outputs)
{
  for (std::string const& o : outputs) {
    // Make sure the file will not be generated into the source
    // directory during an out of source build.
    if (!this->Makefile->CanIWriteThisFile(o)) {
      std::string e = "attempted to have a file \"" + o +
        "\" in a source directory as an output of custom command.";
      this->SetError(e);
      cmSystemTools::SetFatalErrorOccured();
      return false;
    }

    // Make sure the output file name has no invalid characters.
    std::string::size_type pos = o.find_first_of("#<>");
    if (pos != std::string::npos) {
      std::ostringstream msg;
      msg << "called with OUTPUT containing a \"" << o[pos]
          << "\".  This character is not allowed.";
      this->SetError(msg.str());
      return false;
    }
  }
  return true;
}